

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O0

void rune_autoinscribe(player *p,wchar_t i)

{
  loc_conflict grid;
  _Bool _Var1;
  object *local_20;
  object *obj;
  wchar_t i_local;
  player *p_local;
  
  _Var1 = player_knows_rune(p,(long)i);
  if (_Var1) {
    if (cave != (chunk_conflict *)0x0) {
      grid.x = (p->grid).x;
      grid.y = (p->grid).y;
      for (local_20 = square_object((chunk *)cave,grid); local_20 != (object *)0x0;
          local_20 = local_20->next) {
        _Var1 = object_has_rune(local_20,i);
        if (_Var1) {
          rune_add_autoinscription(local_20,i);
        }
      }
    }
    for (local_20 = p->gear; local_20 != (object *)0x0; local_20 = local_20->next) {
      _Var1 = object_has_rune(local_20,i);
      if (_Var1) {
        rune_add_autoinscription(local_20,i);
      }
    }
  }
  return;
}

Assistant:

void rune_autoinscribe(struct player *p, int i)
{
	struct object *obj;

	/* Check the player knows the rune */
	if (!player_knows_rune(p, i)) {
		return;
	}

	/* Autoinscribe each object on the ground */
	if (cave)
		for (obj = square_object(cave, p->grid); obj; obj = obj->next)
			if (object_has_rune(obj, i))
				rune_add_autoinscription(obj, i);

	/* Autoinscribe each object in the inventory */
	for (obj = p->gear; obj; obj = obj->next)
		if (object_has_rune(obj, i))
			rune_add_autoinscription(obj, i);
}